

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_glsl_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t length)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  CompilerError *pCVar4;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  mapped_type *this_00;
  uint32_t uVar7;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar8;
  bool local_4f4;
  bool local_4f1;
  TypedID<(spirv_cross::Types)0> local_4ac;
  TypedID<(spirv_cross::Types)0> local_4a8;
  uint local_4a4;
  uint32_t *local_4a0;
  uint32_t *max_id;
  string expr_1;
  undefined1 local_478 [64];
  undefined1 local_438 [8];
  SPIRType target_type;
  SPIRType *op1_type;
  string op1;
  undefined1 local_2c0 [8];
  string op0;
  undefined1 local_298 [7];
  bool forward;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [40];
  SPIRType *type_1;
  char local_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [40];
  SPIRType *type;
  char local_130;
  uint local_124;
  uint32_t i;
  undefined1 local_100 [32];
  undefined1 local_e0 [40];
  string expr;
  allocator local_99;
  string local_98 [36];
  BaseType local_74;
  BaseType local_70;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  allocator local_51;
  string local_50 [32];
  GLSLstd450 local_30;
  uint32_t local_2c;
  GLSLstd450 op;
  uint32_t length_local;
  uint32_t *args_local;
  uint32_t local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_30 = eop;
  local_2c = length;
  _op = (TypedID<(spirv_cross::Types)0> *)args;
  args_local._4_4_ = eop;
  local_18 = id;
  eop_local = result_type;
  _id_local = (_Hash_node_base *)this;
  bVar2 = is_legacy(this);
  if ((bVar2) && (bVar2 = is_unsigned_glsl_opcode(local_30), bVar2)) {
    int_type._3_1_ = 1;
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_50,"Unsigned integers are not supported on legacy GLSL targets.",&local_51);
    CompilerError::CompilerError(pCVar4,(string *)local_50);
    int_type._3_1_ = Unknown >> 0x18;
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uint_type = get_integer_width_for_glsl_instruction(this,local_30,&_op->id,local_2c);
  local_70 = to_signed_basetype(uint_type);
  local_74 = to_unsigned_basetype(uint_type);
  uVar1 = eop_local;
  uVar3 = local_18;
  uVar7 = (uint32_t)this;
  switch(local_30) {
  case GLSLstd450Round:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"round");
    break;
  case GLSLstd450RoundEven:
    if (((((this->options).es & 1U) == 0) || ((this->options).version < 300)) &&
       ((((this->options).es & 1U) != 0 || ((this->options).version < 0x82)))) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_98,"roundEven supported only in ESSL 300 and GLSL 130 and up.",&local_99);
      CompilerError::CompilerError(pCVar4,(string *)local_98);
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    emit_unary_func_op(this,eop_local,local_18,_op->id,"roundEven");
    break;
  case GLSLstd450Trunc:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"trunc");
    break;
  case GLSLstd450FAbs:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"abs");
    break;
  case GLSLstd450SAbs:
    emit_unary_func_op_cast(this,eop_local,local_18,_op->id,"abs",local_70,local_70);
    break;
  case GLSLstd450FSign:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"sign");
    break;
  case GLSLstd450SSign:
    emit_unary_func_op_cast(this,eop_local,local_18,_op->id,"sign",local_70,local_70);
    break;
  case GLSLstd450Floor:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"floor");
    break;
  case GLSLstd450Ceil:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"ceil");
    break;
  case GLSLstd450Fract:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"fract");
    break;
  case GLSLstd450Radians:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"radians");
    break;
  case GLSLstd450Degrees:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"degrees");
    break;
  case GLSLstd450Sin:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"sin");
    break;
  case GLSLstd450Cos:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"cos");
    break;
  case GLSLstd450Tan:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"tan");
    break;
  case GLSLstd450Asin:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"asin");
    break;
  case GLSLstd450Acos:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"acos");
    break;
  case GLSLstd450Atan:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"atan");
    break;
  case GLSLstd450Sinh:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"sinh");
    break;
  case GLSLstd450Cosh:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"cosh");
    break;
  case GLSLstd450Tanh:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"tanh");
    break;
  case GLSLstd450Asinh:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"asinh");
    break;
  case GLSLstd450Acosh:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"acosh");
    break;
  case GLSLstd450Atanh:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"atanh");
    break;
  case GLSLstd450Atan2:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"atan");
    break;
  case GLSLstd450Pow:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"pow");
    break;
  case GLSLstd450Exp:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"exp");
    break;
  case GLSLstd450Log:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"log");
    break;
  case GLSLstd450Exp2:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"exp2");
    break;
  case GLSLstd450Log2:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"log2");
    break;
  case GLSLstd450Sqrt:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"sqrt");
    break;
  case GLSLstd450InverseSqrt:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"inversesqrt");
    break;
  case GLSLstd450Determinant:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"determinant");
    break;
  case GLSLstd450MatrixInverse:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"inverse");
    break;
  case GLSLstd450Modf:
    register_call_out_argument(this,_op[1].id);
    pVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_Compiler).forced_temporaries,&local_18);
    type = (SPIRType *)pVar8.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_130 = pVar8.second;
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"modf");
    break;
  case GLSLstd450ModfStruct:
    local_160._32_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,eop_local);
    emit_uninitialized_temporary_expression(this,eop_local,local_18);
    to_expression_abi_cxx11_((CompilerGLSL *)local_160,uVar7,SUB41(local_18,0));
    to_member_name_abi_cxx11_((CompilerGLSL *)local_180,(SPIRType *)this,(uint32_t)local_160._32_8_)
    ;
    to_expression_abi_cxx11_((CompilerGLSL *)local_1a0,uVar7,SUB41(_op->id,0));
    to_expression_abi_cxx11_((CompilerGLSL *)local_1c0,uVar7,SUB41(local_18,0));
    to_member_name_abi_cxx11_((CompilerGLSL *)local_1e0,(SPIRType *)this,(uint32_t)local_160._32_8_)
    ;
    statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],char_const(&)[6],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
               (char (*) [2])0x4dfd16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
               (char (*) [4])0x4f38c2,(char (*) [6])"modf(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
               (char (*) [2])0x4dfd16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
               (char (*) [3])0x4d9ce1);
    ::std::__cxx11::string::~string((string *)local_1e0);
    ::std::__cxx11::string::~string((string *)local_1c0);
    ::std::__cxx11::string::~string((string *)local_1a0);
    ::std::__cxx11::string::~string((string *)local_180);
    ::std::__cxx11::string::~string((string *)local_160);
    break;
  case GLSLstd450FMin:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"min");
    break;
  case GLSLstd450UMin:
    emit_binary_func_op_cast(this,eop_local,local_18,_op->id,_op[1].id,"min",local_74,false);
    break;
  case GLSLstd450SMin:
    emit_binary_func_op_cast(this,eop_local,local_18,_op->id,_op[1].id,"min",local_70,false);
    break;
  case GLSLstd450FMax:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"max");
    break;
  case GLSLstd450UMax:
    emit_binary_func_op_cast(this,eop_local,local_18,_op->id,_op[1].id,"max",local_74,false);
    break;
  case GLSLstd450SMax:
    emit_binary_func_op_cast(this,eop_local,local_18,_op->id,_op[1].id,"max",local_70,false);
    break;
  case GLSLstd450FClamp:
    emit_trinary_func_op(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id,"clamp");
    break;
  case GLSLstd450UClamp:
    emit_trinary_func_op_cast(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id,"clamp",local_74);
    break;
  case GLSLstd450SClamp:
    emit_trinary_func_op_cast(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id,"clamp",local_70);
    break;
  case GLSLstd450FMix:
  case GLSLstd450IMix:
    emit_mix_op(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id);
    break;
  case GLSLstd450Step:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"step");
    break;
  case GLSLstd450SmoothStep:
    emit_trinary_func_op(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id,"smoothstep");
    break;
  case GLSLstd450Fma:
    if (((((this->options).es & 1U) == 0) && ((this->options).version < 400)) ||
       ((((this->options).es & 1U) != 0 && ((this->options).version < 0x140)))) {
      to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_e0,uVar7,SUB41(_op->id,0));
      to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_100,uVar7,SUB41(_op[1].id,0));
      to_enclosed_expression_abi_cxx11_
                ((CompilerGLSL *)&stack0xfffffffffffffee0,uVar7,SUB41(_op[2].id,0));
      join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                ((spirv_cross *)(local_e0 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (char (*) [4])0x4f3a06,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 (char (*) [4])0x4f3a30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffee0);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      ::std::__cxx11::string::~string((string *)local_100);
      ::std::__cxx11::string::~string((string *)local_e0);
      uVar1 = eop_local;
      uVar3 = local_18;
      bVar2 = should_forward(this,_op->id);
      local_4f1 = false;
      if (bVar2) {
        bVar2 = should_forward(this,_op[1].id);
        local_4f1 = false;
        if (bVar2) {
          local_4f1 = should_forward(this,_op[2].id);
        }
      }
      emit_op(this,uVar1,uVar3,(string *)(local_e0 + 0x20),local_4f1,false);
      for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
        Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,_op[local_124].id);
      }
      ::std::__cxx11::string::~string((string *)(local_e0 + 0x20));
    }
    else {
      emit_trinary_func_op(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id,"fma");
    }
    break;
  case GLSLstd450Frexp:
    register_call_out_argument(this,_op[1].id);
    pVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_Compiler).forced_temporaries,&local_18);
    type_1 = (SPIRType *)pVar8.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_1e8 = pVar8.second;
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"frexp");
    break;
  case GLSLstd450FrexpStruct:
    local_218._32_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,eop_local);
    emit_uninitialized_temporary_expression(this,eop_local,local_18);
    to_expression_abi_cxx11_((CompilerGLSL *)local_218,uVar7,SUB41(local_18,0));
    to_member_name_abi_cxx11_((CompilerGLSL *)local_238,(SPIRType *)this,(uint32_t)local_218._32_8_)
    ;
    to_expression_abi_cxx11_((CompilerGLSL *)local_258,uVar7,SUB41(_op->id,0));
    to_expression_abi_cxx11_((CompilerGLSL *)local_278,uVar7,SUB41(local_18,0));
    to_member_name_abi_cxx11_((CompilerGLSL *)local_298,(SPIRType *)this,(uint32_t)local_218._32_8_)
    ;
    statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
               (char (*) [2])0x4dfd16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
               (char (*) [4])0x4f38c2,(char (*) [7])"frexp(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
               (char (*) [2])0x4dfd16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
               (char (*) [3])0x4d9ce1);
    ::std::__cxx11::string::~string((string *)local_298);
    ::std::__cxx11::string::~string((string *)local_278);
    ::std::__cxx11::string::~string((string *)local_258);
    ::std::__cxx11::string::~string((string *)local_238);
    ::std::__cxx11::string::~string((string *)local_218);
    break;
  case GLSLstd450Ldexp:
    bVar2 = should_forward(this,_op->id);
    local_4f4 = false;
    if (bVar2) {
      local_4f4 = should_forward(this,_op[1].id);
    }
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_2c0,uVar7,SUB41(_op->id,0));
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)&op1_type,uVar7,SUB41(_op[1].id,0));
    target_type.member_name_cache._M_h._M_single_bucket =
         (__node_base_ptr)Compiler::expression_type(&this->super_Compiler,_op[1].id);
    if (*(int *)&(((SPIRType *)target_type.member_name_cache._M_h._M_single_bucket)->super_IVariant)
                 .field_0xc != 7) {
      SPIRType::SPIRType((SPIRType *)local_438,
                         (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
      target_type.super_IVariant._vptr_IVariant._4_4_ = 7;
      type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_478,(SPIRType *)this);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                ((spirv_cross *)(local_478 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478,
                 (char (*) [2])0x4f3f9c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op1_type,
                 (char (*) [2])0x4dff7a);
      ::std::__cxx11::string::operator=((string *)&op1_type,(string *)(local_478 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_478 + 0x20));
      ::std::__cxx11::string::~string((string *)local_478);
      SPIRType::~SPIRType((SPIRType *)local_438);
    }
    join<char_const(&)[7],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              ((spirv_cross *)&max_id,(char (*) [7])"ldexp(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op1_type,
               (char (*) [2])0x4dff7a);
    emit_op(this,eop_local,local_18,(string *)&max_id,local_4f4,false);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,_op->id);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,_op[1].id);
    ::std::__cxx11::string::~string((string *)&max_id);
    ::std::__cxx11::string::~string((string *)&op1_type);
    ::std::__cxx11::string::~string((string *)local_2c0);
    break;
  case GLSLstd450PackSnorm4x8:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"packSnorm4x8");
    break;
  case GLSLstd450PackUnorm4x8:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"packUnorm4x8");
    break;
  case GLSLstd450PackSnorm2x16:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"packSnorm2x16");
    break;
  case GLSLstd450PackUnorm2x16:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"packUnorm2x16");
    break;
  case GLSLstd450PackHalf2x16:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"packHalf2x16");
    break;
  case GLSLstd450PackDouble2x32:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"packDouble2x32");
    break;
  case GLSLstd450UnpackSnorm2x16:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"unpackSnorm2x16");
    break;
  case GLSLstd450UnpackUnorm2x16:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"unpackUnorm2x16");
    break;
  case GLSLstd450UnpackHalf2x16:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"unpackHalf2x16");
    break;
  case GLSLstd450UnpackSnorm4x8:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"unpackSnorm4x8");
    break;
  case GLSLstd450UnpackUnorm4x8:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"unpackUnorm4x8");
    break;
  case GLSLstd450UnpackDouble2x32:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"unpackDouble2x32");
    break;
  case GLSLstd450Length:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"length");
    break;
  case GLSLstd450Distance:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"distance");
    break;
  case GLSLstd450Cross:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"cross");
    break;
  case GLSLstd450Normalize:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"normalize");
    break;
  case GLSLstd450FaceForward:
    emit_trinary_func_op(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id,"faceforward");
    break;
  case GLSLstd450Reflect:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"reflect");
    break;
  case GLSLstd450Refract:
    emit_trinary_func_op(this,eop_local,local_18,_op->id,_op[1].id,_op[2].id,"refract");
    break;
  case GLSLstd450FindILsb:
    uVar7 = _op->id;
    pSVar5 = Compiler::expression_type(&this->super_Compiler,_op->id);
    emit_unary_func_op_cast
              (this,uVar1,uVar3,uVar7,"findLSB",*(BaseType *)&(pSVar5->super_IVariant).field_0xc,
               local_70);
    break;
  case GLSLstd450FindSMsb:
    emit_unary_func_op_cast(this,eop_local,local_18,_op->id,"findMSB",local_70,local_70);
    break;
  case GLSLstd450FindUMsb:
    emit_unary_func_op_cast(this,eop_local,local_18,_op->id,"findMSB",local_74,local_70);
    break;
  case GLSLstd450InterpolateAtCentroid:
    emit_unary_func_op(this,eop_local,local_18,_op->id,"interpolateAtCentroid");
    break;
  case GLSLstd450InterpolateAtSample:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"interpolateAtSample");
    break;
  case GLSLstd450InterpolateAtOffset:
    emit_binary_func_op(this,eop_local,local_18,_op->id,_op[1].id,"interpolateAtOffset");
    break;
  case GLSLstd450NMin:
  case GLSLstd450NMax:
    emit_nminmax_op(this,eop_local,local_18,_op->id,_op[1].id,local_30);
    break;
  case GLSLstd450NClamp:
    local_4a4 = local_18 | 0x80000000;
    local_4a0 = ::std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&this->extra_sub_expressions,&local_4a4);
    if (*local_4a0 == 0) {
      uVar3 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
      *local_4a0 = uVar3;
    }
    TypedID<(spirv_cross::Types)0>::TypedID(&local_4a8,local_18);
    pmVar6 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&local_4a8);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_4ac,*local_4a0);
    this_00 = ::std::
              unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
              ::operator[](&(this->super_Compiler).ir.meta,&local_4ac);
    Meta::operator=(this_00,pmVar6);
    emit_nminmax_op(this,eop_local,*local_4a0,_op->id,_op[1].id,GLSLstd450NMax);
    emit_nminmax_op(this,eop_local,local_18,*local_4a0,_op[2].id,GLSLstd450NMin);
    break;
  default:
    statement<char_const(&)[26],unsigned_int&>
              (this,(char (*) [26])"// unimplemented GLSL op ",(uint *)((long)&args_local + 4));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t length)
{
	auto op = static_cast<GLSLstd450>(eop);

	if (is_legacy() && is_unsigned_glsl_opcode(op))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy GLSL targets.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, length);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	// FP fiddling
	case GLSLstd450Round:
		emit_unary_func_op(result_type, id, args[0], "round");
		break;

	case GLSLstd450RoundEven:
		if ((options.es && options.version >= 300) || (!options.es && options.version >= 130))
			emit_unary_func_op(result_type, id, args[0], "roundEven");
		else
			SPIRV_CROSS_THROW("roundEven supported only in ESSL 300 and GLSL 130 and up.");
		break;

	case GLSLstd450Trunc:
		emit_unary_func_op(result_type, id, args[0], "trunc");
		break;
	case GLSLstd450SAbs:
		emit_unary_func_op_cast(result_type, id, args[0], "abs", int_type, int_type);
		break;
	case GLSLstd450FAbs:
		emit_unary_func_op(result_type, id, args[0], "abs");
		break;
	case GLSLstd450SSign:
		emit_unary_func_op_cast(result_type, id, args[0], "sign", int_type, int_type);
		break;
	case GLSLstd450FSign:
		emit_unary_func_op(result_type, id, args[0], "sign");
		break;
	case GLSLstd450Floor:
		emit_unary_func_op(result_type, id, args[0], "floor");
		break;
	case GLSLstd450Ceil:
		emit_unary_func_op(result_type, id, args[0], "ceil");
		break;
	case GLSLstd450Fract:
		emit_unary_func_op(result_type, id, args[0], "fract");
		break;
	case GLSLstd450Radians:
		emit_unary_func_op(result_type, id, args[0], "radians");
		break;
	case GLSLstd450Degrees:
		emit_unary_func_op(result_type, id, args[0], "degrees");
		break;
	case GLSLstd450Fma:
		if ((!options.es && options.version < 400) || (options.es && options.version < 320))
		{
			auto expr = join(to_enclosed_expression(args[0]), " * ", to_enclosed_expression(args[1]), " + ",
			                 to_enclosed_expression(args[2]));

			emit_op(result_type, id, expr,
			        should_forward(args[0]) && should_forward(args[1]) && should_forward(args[2]));
			for (uint32_t i = 0; i < 3; i++)
				inherit_expression_dependencies(id, args[i]);
		}
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fma");
		break;
	case GLSLstd450Modf:
		register_call_out_argument(args[1]);
		forced_temporaries.insert(id);
		emit_binary_func_op(result_type, id, args[0], args[1], "modf");
		break;

	case GLSLstd450ModfStruct:
	{
		auto &type = get<SPIRType>(result_type);
		emit_uninitialized_temporary_expression(result_type, id);
		statement(to_expression(id), ".", to_member_name(type, 0), " = ", "modf(", to_expression(args[0]), ", ",
		          to_expression(id), ".", to_member_name(type, 1), ");");
		break;
	}

	// Minmax
	case GLSLstd450UMin:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "min", uint_type, false);
		break;

	case GLSLstd450SMin:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "min", int_type, false);
		break;

	case GLSLstd450FMin:
		emit_binary_func_op(result_type, id, args[0], args[1], "min");
		break;

	case GLSLstd450FMax:
		emit_binary_func_op(result_type, id, args[0], args[1], "max");
		break;

	case GLSLstd450UMax:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "max", uint_type, false);
		break;

	case GLSLstd450SMax:
		emit_binary_func_op_cast(result_type, id, args[0], args[1], "max", int_type, false);
		break;

	case GLSLstd450FClamp:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		break;

	case GLSLstd450UClamp:
		emit_trinary_func_op_cast(result_type, id, args[0], args[1], args[2], "clamp", uint_type);
		break;

	case GLSLstd450SClamp:
		emit_trinary_func_op_cast(result_type, id, args[0], args[1], args[2], "clamp", int_type);
		break;

	// Trig
	case GLSLstd450Sin:
		emit_unary_func_op(result_type, id, args[0], "sin");
		break;
	case GLSLstd450Cos:
		emit_unary_func_op(result_type, id, args[0], "cos");
		break;
	case GLSLstd450Tan:
		emit_unary_func_op(result_type, id, args[0], "tan");
		break;
	case GLSLstd450Asin:
		emit_unary_func_op(result_type, id, args[0], "asin");
		break;
	case GLSLstd450Acos:
		emit_unary_func_op(result_type, id, args[0], "acos");
		break;
	case GLSLstd450Atan:
		emit_unary_func_op(result_type, id, args[0], "atan");
		break;
	case GLSLstd450Sinh:
		emit_unary_func_op(result_type, id, args[0], "sinh");
		break;
	case GLSLstd450Cosh:
		emit_unary_func_op(result_type, id, args[0], "cosh");
		break;
	case GLSLstd450Tanh:
		emit_unary_func_op(result_type, id, args[0], "tanh");
		break;
	case GLSLstd450Asinh:
		emit_unary_func_op(result_type, id, args[0], "asinh");
		break;
	case GLSLstd450Acosh:
		emit_unary_func_op(result_type, id, args[0], "acosh");
		break;
	case GLSLstd450Atanh:
		emit_unary_func_op(result_type, id, args[0], "atanh");
		break;
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan");
		break;

	// Exponentials
	case GLSLstd450Pow:
		emit_binary_func_op(result_type, id, args[0], args[1], "pow");
		break;
	case GLSLstd450Exp:
		emit_unary_func_op(result_type, id, args[0], "exp");
		break;
	case GLSLstd450Log:
		emit_unary_func_op(result_type, id, args[0], "log");
		break;
	case GLSLstd450Exp2:
		emit_unary_func_op(result_type, id, args[0], "exp2");
		break;
	case GLSLstd450Log2:
		emit_unary_func_op(result_type, id, args[0], "log2");
		break;
	case GLSLstd450Sqrt:
		emit_unary_func_op(result_type, id, args[0], "sqrt");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "inversesqrt");
		break;

	// Matrix math
	case GLSLstd450Determinant:
		emit_unary_func_op(result_type, id, args[0], "determinant");
		break;
	case GLSLstd450MatrixInverse:
		emit_unary_func_op(result_type, id, args[0], "inverse");
		break;

	// Lerping
	case GLSLstd450FMix:
	case GLSLstd450IMix:
	{
		emit_mix_op(result_type, id, args[0], args[1], args[2]);
		break;
	}
	case GLSLstd450Step:
		emit_binary_func_op(result_type, id, args[0], args[1], "step");
		break;
	case GLSLstd450SmoothStep:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "smoothstep");
		break;

	// Packing
	case GLSLstd450Frexp:
		register_call_out_argument(args[1]);
		forced_temporaries.insert(id);
		emit_binary_func_op(result_type, id, args[0], args[1], "frexp");
		break;

	case GLSLstd450FrexpStruct:
	{
		auto &type = get<SPIRType>(result_type);
		emit_uninitialized_temporary_expression(result_type, id);
		statement(to_expression(id), ".", to_member_name(type, 0), " = ", "frexp(", to_expression(args[0]), ", ",
		          to_expression(id), ".", to_member_name(type, 1), ");");
		break;
	}

	case GLSLstd450Ldexp:
	{
		bool forward = should_forward(args[0]) && should_forward(args[1]);

		auto op0 = to_unpacked_expression(args[0]);
		auto op1 = to_unpacked_expression(args[1]);
		auto &op1_type = expression_type(args[1]);
		if (op1_type.basetype != SPIRType::Int)
		{
			// Need a value cast here.
			auto target_type = op1_type;
			target_type.basetype = SPIRType::Int;
			op1 = join(type_to_glsl_constructor(target_type), "(", op1, ")");
		}

		auto expr = join("ldexp(", op0, ", ", op1, ")");

		emit_op(result_type, id, expr, forward);
		inherit_expression_dependencies(id, args[0]);
		inherit_expression_dependencies(id, args[1]);
		break;
	}

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "packSnorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "packUnorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "packSnorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "packUnorm2x16");
		break;
	case GLSLstd450PackHalf2x16:
		emit_unary_func_op(result_type, id, args[0], "packHalf2x16");
		break;
	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpackSnorm4x8");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpackUnorm4x8");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpackSnorm2x16");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpackUnorm2x16");
		break;
	case GLSLstd450UnpackHalf2x16:
		emit_unary_func_op(result_type, id, args[0], "unpackHalf2x16");
		break;

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "packDouble2x32");
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unpackDouble2x32");
		break;

	// Vector math
	case GLSLstd450Length:
		emit_unary_func_op(result_type, id, args[0], "length");
		break;
	case GLSLstd450Distance:
		emit_binary_func_op(result_type, id, args[0], args[1], "distance");
		break;
	case GLSLstd450Cross:
		emit_binary_func_op(result_type, id, args[0], args[1], "cross");
		break;
	case GLSLstd450Normalize:
		emit_unary_func_op(result_type, id, args[0], "normalize");
		break;
	case GLSLstd450FaceForward:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "faceforward");
		break;
	case GLSLstd450Reflect:
		emit_binary_func_op(result_type, id, args[0], args[1], "reflect");
		break;
	case GLSLstd450Refract:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "refract");
		break;

	// Bit-fiddling
	case GLSLstd450FindILsb:
		// findLSB always returns int.
		emit_unary_func_op_cast(result_type, id, args[0], "findLSB", expression_type(args[0]).basetype, int_type);
		break;

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "findMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "findMSB", uint_type,
		                        int_type); // findMSB always returns int.
		break;

	// Multisampled varying
	case GLSLstd450InterpolateAtCentroid:
		emit_unary_func_op(result_type, id, args[0], "interpolateAtCentroid");
		break;
	case GLSLstd450InterpolateAtSample:
		emit_binary_func_op(result_type, id, args[0], args[1], "interpolateAtSample");
		break;
	case GLSLstd450InterpolateAtOffset:
		emit_binary_func_op(result_type, id, args[0], args[1], "interpolateAtOffset");
		break;

	case GLSLstd450NMin:
	case GLSLstd450NMax:
	{
		emit_nminmax_op(result_type, id, args[0], args[1], op);
		break;
	}

	case GLSLstd450NClamp:
	{
		// Make sure we have a unique ID here to avoid aliasing the extra sub-expressions between clamp and NMin sub-op.
		// IDs cannot exceed 24 bits, so we can make use of the higher bits for some unique flags.
		uint32_t &max_id = extra_sub_expressions[id | 0x80000000u];
		if (!max_id)
			max_id = ir.increase_bound_by(1);

		// Inherit precision qualifiers.
		ir.meta[max_id] = ir.meta[id];

		emit_nminmax_op(result_type, max_id, args[0], args[1], GLSLstd450NMax);
		emit_nminmax_op(result_type, id, max_id, args[2], GLSLstd450NMin);
		break;
	}

	default:
		statement("// unimplemented GLSL op ", eop);
		break;
	}
}